

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_gf2m.c
# Opt level: O0

int BN_GF2m_mod_sqr_arr(BIGNUM *r,BIGNUM *a,int *p,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a_00;
  BIGNUM *pBVar2;
  BN_CTX *in_RCX;
  long *in_RSI;
  int *in_RDI;
  BIGNUM *unaff_retaddr;
  BIGNUM *s;
  int ret;
  int i;
  int in_stack_ffffffffffffffcc;
  int local_28;
  int local_24;
  
  local_28 = 0;
  BN_CTX_start(in_RCX);
  a_00 = BN_CTX_get(in_RCX);
  if ((a_00 != (BIGNUM *)0x0) &&
     (pBVar2 = bn_wexpand((BIGNUM *)a_00,in_stack_ffffffffffffffcc), pBVar2 != (BIGNUM *)0x0)) {
    local_24 = (int)in_RSI[1];
    while (local_24 = local_24 + -1, -1 < local_24) {
      ((BIGNUM *)a_00)->d[local_24 * 2 + 1] =
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x3c & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x3c & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x3c & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x3c & 1) << 0x38 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x38 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x38 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x38 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x38 & 1) << 0x30 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x34 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x34 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x34 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x34 & 1) << 0x28 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x30 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x30 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x30 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x30 & 1) << 0x20 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x2c & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x2c & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x2c & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x2c & 1) << 0x18 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x28 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x28 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x28 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x28 & 1) << 0x10 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x24 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x24 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x24 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x24 & 1) << 8 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x20 & 8) << 3 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x20 & 4) << 2 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x20 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x20 & 1;
      ((BIGNUM *)a_00)->d[local_24 * 2] =
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x1c & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x1c & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x1c & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x1c & 1) << 0x38 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x18 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x18 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x18 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x18 & 1) << 0x30 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x14 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x14 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x14 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x14 & 1) << 0x28 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x10 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x10 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x10 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0x10 & 1) << 0x20 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0xc & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0xc & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 0xc & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 0xc & 1) << 0x18 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 8 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 8 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 8 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 8 & 1) << 0x10 |
           ((*(ulong *)(*in_RSI + (long)local_24 * 8) >> 4 & 8) << 3 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 4 & 4) << 2 |
            (*(ulong *)(*in_RSI + (long)local_24 * 8) >> 4 & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) >> 4 & 1) << 8 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) & 8) << 3 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) & 4) << 2 |
           (*(ulong *)(*in_RSI + (long)local_24 * 8) & 2) << 1 |
           *(ulong *)(*in_RSI + (long)local_24 * 8) & 1;
    }
    ((BIGNUM *)a_00)->top = (int)in_RSI[1] << 1;
    bn_correct_top((BIGNUM *)a_00);
    iVar1 = BN_GF2m_mod_arr(s,unaff_retaddr,in_RDI);
    if (iVar1 != 0) {
      local_28 = 1;
    }
  }
  BN_CTX_end(in_RCX);
  return local_28;
}

Assistant:

int BN_GF2m_mod_sqr_arr(BIGNUM *r, const BIGNUM *a, const int p[],
                        BN_CTX *ctx)
{
    int i, ret = 0;
    BIGNUM *s;

    bn_check_top(a);
    BN_CTX_start(ctx);
    if ((s = BN_CTX_get(ctx)) == NULL)
        goto err;
    if (!bn_wexpand(s, 2 * a->top))
        goto err;

    for (i = a->top - 1; i >= 0; i--) {
        s->d[2 * i + 1] = SQR1(a->d[i]);
        s->d[2 * i] = SQR0(a->d[i]);
    }

    s->top = 2 * a->top;
    bn_correct_top(s);
    if (!BN_GF2m_mod_arr(r, s, p))
        goto err;
    bn_check_top(r);
    ret = 1;
 err:
    BN_CTX_end(ctx);
    return ret;
}